

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doEndTryTable(SpillPointers *self,Expression **currp)

{
  pointer *pppEVar1;
  pointer pvVar2;
  pointer ppBVar3;
  TryTable *expr;
  mapped_type *this;
  pointer ppBVar4;
  undefined1 local_88 [8];
  NameSet catchTargets;
  Name target;
  BasicBlock *pred;
  
  expr = Expression::cast<wasm::TryTable>(*currp);
  BranchUtils::getUniqueTargets((NameSet *)local_88,(Expression *)expr);
  for (; catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_node_base *)&catchTargets;
      catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           std::_Rb_tree_increment
                     (catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)) {
    catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         *(size_t *)(catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1);
    target.super_IString.str._M_len =
         (size_t)catchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_parent;
    pvVar2 = *(pointer *)
              ((long)&(self->
                      super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                      .
                      super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                      .throwingInstsStack.
                      super__Vector_base<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    ppBVar3 = pvVar2[-1].
              super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar4 = pvVar2[-1].
                   super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar3;
        ppBVar4 = ppBVar4 + 1) {
      target.super_IString.str._M_str = (char *)*ppBVar4;
      this = std::
             map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
             ::operator[](&(self->
                           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                           ).
                           super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                           .
                           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                           .branches,
                          (key_type *)&catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                         );
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::push_back(this,(value_type *)&target.super_IString.str._M_str);
    }
  }
  std::
  vector<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
  ::pop_back(&(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
              ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
              .
              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
              .throwingInstsStack);
  pppEVar1 = (pointer *)
             ((long)&(self->
                     super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                     .
                     super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                     .tryStack.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  *pppEVar1 = *pppEVar1 + -1;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_88);
  return;
}

Assistant:

static void doEndTryTable(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<TryTable>();

    auto catchTargets = BranchUtils::getUniqueTargets(curr);
    // Add catch destinations to the targets.
    for (auto target : catchTargets) {
      auto& preds = self->throwingInstsStack.back();
      for (auto* pred : preds) {
        self->branches[target].push_back(pred);
      }
    }

    self->throwingInstsStack.pop_back();
    self->tryStack.pop_back();
  }